

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void dwt_encode(opj_tcd_tilecomp_t *tilec)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  opj_tcd_resolution_t *poVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int x;
  int sn;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  int sn_00;
  int iVar15;
  ulong uVar16;
  
  if (1 < (long)tilec->numresolutions) {
    x = tilec->x1 - tilec->x0;
    piVar3 = tilec->data;
    uVar9 = (long)tilec->numresolutions - 1;
    uVar12 = 0;
    do {
      poVar4 = tilec->resolutions;
      lVar10 = uVar9 - uVar12;
      iVar1 = poVar4[lVar10].x1;
      uVar2 = poVar4[lVar10].x0;
      iVar15 = poVar4[lVar10].y0;
      uVar16 = (long)poVar4[lVar10].y1 - (long)iVar15;
      sn = poVar4[lVar10 + -1].x1 - poVar4[lVar10 + -1].x0;
      sn_00 = poVar4[lVar10 + -1].y1 - poVar4[lVar10 + -1].y0;
      piVar7 = (int *)malloc(uVar16 * 4);
      uVar13 = uVar16 & 0xffffffff;
      uVar5 = iVar1 - uVar2;
      iVar6 = (int)uVar16;
      if (uVar5 != 0 && (int)uVar2 <= iVar1) {
        iVar15 = iVar15 - (((uint)((ulong)(long)iVar15 >> 0x1f) & 1) + iVar15 & 0xfffffffe);
        uVar16 = 0;
        piVar14 = piVar3;
        do {
          if (0 < iVar6) {
            uVar11 = 0;
            piVar8 = piVar14;
            do {
              piVar7[uVar11] = *piVar8;
              uVar11 = uVar11 + 1;
              piVar8 = piVar8 + x;
            } while (uVar13 != uVar11);
          }
          dwt_encode_1(piVar7,iVar6 - sn_00,sn_00,iVar15);
          dwt_deinterleave_v(piVar7,piVar3 + uVar16,iVar6 - sn_00,sn_00,x,iVar15);
          uVar16 = uVar16 + 1;
          piVar14 = piVar14 + 1;
        } while (uVar16 != uVar5);
      }
      free(piVar7);
      piVar7 = (int *)malloc((long)(int)uVar5 << 2);
      if (0 < iVar6) {
        iVar15 = 0;
        piVar14 = piVar3;
        do {
          if (0 < (int)uVar5) {
            memcpy(piVar7,piVar3 + iVar15,(ulong)(iVar1 + ~uVar2) * 4 + 4);
          }
          dwt_encode_1(piVar7,uVar5 - sn,sn,(int)uVar2 % 2);
          dwt_deinterleave_h(piVar7,piVar14,uVar5 - sn,sn,(int)uVar2 % 2);
          iVar15 = iVar15 + x;
          piVar14 = piVar14 + x;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      free(piVar7);
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uVar9 & 0xffffffff));
  }
  return;
}

Assistant:

void dwt_encode(opj_tcd_tilecomp_t * tilec) {
	int i, j, k;
	int *a = NULL;
	int *aj = NULL;
	int *bj = NULL;
	int w, l;
	
	w = tilec->x1-tilec->x0;
	l = tilec->numresolutions-1;
	a = tilec->data;
	
	for (i = 0; i < l; i++) {
		int rw;			/* width of the resolution level computed                                                           */
		int rh;			/* height of the resolution level computed                                                          */
		int rw1;		/* width of the resolution level once lower than computed one                                       */
		int rh1;		/* height of the resolution level once lower than computed one                                      */
		int cas_col;	/* 0 = non inversion on horizontal filtering 1 = inversion between low-pass and high-pass filtering */
		int cas_row;	/* 0 = non inversion on vertical filtering 1 = inversion between low-pass and high-pass filtering   */
		int dn, sn;
		
		rw = tilec->resolutions[l - i].x1 - tilec->resolutions[l - i].x0;
		rh = tilec->resolutions[l - i].y1 - tilec->resolutions[l - i].y0;
		rw1= tilec->resolutions[l - i - 1].x1 - tilec->resolutions[l - i - 1].x0;
		rh1= tilec->resolutions[l - i - 1].y1 - tilec->resolutions[l - i - 1].y0;
		
		cas_row = tilec->resolutions[l - i].x0 % 2;
		cas_col = tilec->resolutions[l - i].y0 % 2;
        
		sn = rh1;
		dn = rh - rh1;
		bj = (int*)opj_malloc(rh * sizeof(int));
		for (j = 0; j < rw; j++) {
			aj = a + j;
			for (k = 0; k < rh; k++)  bj[k] = aj[k*w];
			dwt_encode_1(bj, dn, sn, cas_col);
			dwt_deinterleave_v(bj, aj, dn, sn, w, cas_col);
		}
		opj_free(bj);
		
		sn = rw1;
		dn = rw - rw1;
		bj = (int*)opj_malloc(rw * sizeof(int));
		for (j = 0; j < rh; j++) {
			aj = a + j * w;
			for (k = 0; k < rw; k++)  bj[k] = aj[k];
			dwt_encode_1(bj, dn, sn, cas_row);
			dwt_deinterleave_h(bj, aj, dn, sn, cas_row);
		}
		opj_free(bj);
	}
}